

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpPrepass::OnDataSymbol
          (BinaryReaderObjdumpPrepass *this,Index index,uint32_t flags,string_view name,
          Index segment,uint32_t offset,uint32_t size)

{
  string_view local_58;
  ObjdumpSymbol local_48;
  
  local_58.size_ = name.size_;
  local_58.data_ = name.data_;
  local_48.kind = Data;
  string_view::to_string_abi_cxx11_(&local_48.name,&local_58);
  local_48.index = 0;
  ObjdumpSymbol::operator=
            ((((this->super_BinaryReaderObjdumpBase).objdump_state_)->symtab).
             super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>._M_impl.
             super__Vector_impl_data._M_start + index,&local_48);
  std::__cxx11::string::_M_dispose();
  return (Result)Ok;
}

Assistant:

Result OnDataSymbol(Index index,
                      uint32_t flags,
                      string_view name,
                      Index segment,
                      uint32_t offset,
                      uint32_t size) override {
    objdump_state_->symtab[index] = {SymbolType::Data, name.to_string(), 0};
    return Result::Ok;
  }